

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyAtomicOperations
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  pointer __s;
  pointer puVar1;
  byte bVar2;
  bool bVar3;
  GLenum GVar4;
  int iVar5;
  ostream *poVar6;
  undefined8 extraout_RAX;
  TestError *this_00;
  undefined4 in_register_0000000c;
  GLint y;
  int iVar7;
  size_type __new_size;
  Functions *gl_00;
  SparseTexture2CommitmentTestCase *this_01;
  char *__s_00;
  GLenum target_00;
  undefined1 *puVar8;
  GLint z;
  int iVar9;
  GLint x;
  int iVar10;
  GLint depth;
  GLint height;
  GLint width;
  GLuint verifyTexture;
  int local_404;
  undefined4 local_400;
  GLint local_3fc;
  undefined8 local_3f8;
  GLint local_3f0;
  int local_3ec;
  Functions *local_3e8;
  UncommittedRegionsAccessTestCase *local_3e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  string dataType;
  string local_370;
  string shader;
  string local_330;
  ShaderProgram program;
  TokenStrings s;
  ProgramSources sources;
  
  local_3f8 = CONCAT44(in_register_0000000c,format);
  puVar8 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
            field_0x88;
  local_3e8 = gl;
  poVar6 = std::operator<<((ostream *)puVar8,"Verify Atomic Operations [level: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,level);
  std::operator<<(poVar6,"] - ");
  if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0x75e);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
  local_3ec = width / 2;
  bVar2 = 1;
  if ((height != 0 && 2 < width + 1U) &&
     ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      minDepth <= depth)) {
    target_00 = 0x8c1a;
    if (target == 0x9100) {
      target_00 = 0xde1;
    }
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __new_size = (size_type)(height * width * depth);
    local_3fc = target;
    local_3f0 = level;
    local_3e0 = this;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,__new_size);
    puVar1 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __s = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0,__new_size);
    gl_00 = local_3e8;
    gl4cts::Texture::Generate(local_3e8,&verifyTexture);
    gl4cts::Texture::Bind(gl_00,verifyTexture,target_00);
    gl4cts::Texture::Storage(gl_00,target_00,1,0x8229,width,height,depth);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"Texture::Storage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0x784);
    local_400 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    iVar10 = 0;
    while (iVar10 < (local_3e0->super_SparseTexture2CommitmentTestCase).
                    super_SparseTextureCommitmentTestCase.mState.samples) {
      local_404 = iVar10;
      memset(__s,0xff,__new_size);
      gl4cts::Texture::Bind(gl_00,verifyTexture,target_00);
      gl4cts::Texture::SubImage(gl_00,target_00,0,0,0,0,width,height,depth,0x1903,0x1401,__s);
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"Texture::SubImage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                      ,0x78d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shader,st2_compute_atomicVerify,(allocator<char> *)&s);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"image",(allocator<char> *)&sources);
      this_01 = (SparseTexture2CommitmentTestCase *)0x17f97b4;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"image",(allocator<char> *)&program);
      SparseTexture2CommitmentTestCase::createShaderTokens
                (&s,this_01,local_3fc,(GLint)local_3f8,local_404,&local_370,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_370);
      bVar3 = std::operator==(&s.returnType,"ivec4");
      __s_00 = "uint";
      if (bVar3) {
        __s_00 = "int";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dataType,__s_00,(allocator<char> *)&sources);
      replaceToken("<OUTPUT_TYPE>",s.outputType._M_dataplus._M_p,&shader);
      replaceToken("<FORMAT>",s.format._M_dataplus._M_p,&shader);
      replaceToken("<INPUT_TYPE>",s.inputType._M_dataplus._M_p,&shader);
      replaceToken("<POINT_TYPE>",s.pointType._M_dataplus._M_p,&shader);
      replaceToken("<POINT_DEF>",s.pointDef._M_dataplus._M_p,&shader);
      replaceToken("<DATA_TYPE>",dataType._M_dataplus._M_p,&shader);
      replaceToken("<SAMPLE_DEF>",s.sampleDef._M_dataplus._M_p,&shader);
      replaceToken("<RETURN_TYPE>",s.returnType._M_dataplus._M_p,&shader);
      memset(&sources,0,0xac);
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      sources._193_8_ = 0;
      glu::ComputeSource::ComputeSource((ComputeSource *)&program,&shader);
      glu::ProgramSources::operator<<(&sources,(ShaderSource *)&program);
      std::__cxx11::string::~string
                ((string *)
                 &program.m_shaders[0].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      glu::ShaderProgram::ShaderProgram
                (&program,((local_3e0->super_SparseTexture2CommitmentTestCase).
                           super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                          m_renderCtx,&sources);
      if (program.m_program.m_info.linkOk == true) {
        (*gl_00->useProgram)(program.m_program.m_program);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"glUseProgram",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x7a6);
        (*gl_00->bindImageTexture)(0,verifyTexture,0,'\0',0,0x88b9,0x8232);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x7ad);
        (*gl_00->bindImageTexture)(1,*texture,local_3f0,'\0',0,35000,(GLenum)local_3f8);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x7b4);
        (*gl_00->uniform1i)(1,0);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x7b6);
        (*gl_00->uniform1i)(2,1);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x7b8);
        (*gl_00->uniform1i)(3,local_3ec);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x7ba);
        (*gl_00->dispatchCompute)(width,height,depth);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"glDispatchCompute",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x7bc);
        (*gl_00->memoryBarrier)(0xffffffff);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"glMemoryBarrier",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x7be);
        gl4cts::Texture::GetData(gl_00,0,target_00,0x1903,0x1401,__s);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"Texture::GetData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x7c1);
        for (iVar10 = 0; gl_00 = local_3e8, iVar10 < width; iVar10 = iVar10 + 1) {
          for (iVar7 = 0; iVar7 < height; iVar7 = iVar7 + 1) {
            for (iVar9 = 0; iVar9 < depth; iVar9 = iVar9 + 1) {
              iVar5 = (height * iVar9 + iVar7) * width + iVar10;
              if (puVar1[iVar5] != __s[iVar5]) {
                local_400 = 0;
                printf("%d:%d ");
              }
            }
          }
        }
      }
      else {
        poVar6 = std::operator<<((ostream *)puVar8,
                                 "Compute shader compilation failed (atomic) for target: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3fc);
        poVar6 = std::operator<<(poVar6,", format: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_3f8);
        poVar6 = std::operator<<(poVar6,", sample: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_404);
        poVar6 = std::operator<<(poVar6,", infoLog: ");
        poVar6 = std::operator<<(poVar6,(string *)
                                        &((*program.m_shaders[5].
                                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                         infoLog);
        poVar6 = std::operator<<(poVar6,", shaderSource: ");
        poVar6 = std::operator<<(poVar6,shader._M_dataplus._M_p);
        std::operator<<(poVar6," - ");
        local_400 = 0;
      }
      glu::ShaderProgram::~ShaderProgram(&program);
      glu::ProgramSources::~ProgramSources(&sources);
      std::__cxx11::string::~string((string *)&dataType);
      SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings(&s);
      std::__cxx11::string::~string((string *)&shader);
      iVar10 = local_404 + 1;
    }
    gl4cts::Texture::Delete(gl_00,&verifyTexture);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    bVar2 = (byte)local_400;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyAtomicOperations(const Functions& gl, GLint target, GLint format,
															  GLuint& texture, GLint level)
{
	mLog << "Verify Atomic Operations [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	// Create verifying texture
	GLint verifyTarget;
	if (target == GL_TEXTURE_2D_MULTISAMPLE)
		verifyTarget = GL_TEXTURE_2D;
	else
		verifyTarget = GL_TEXTURE_2D_ARRAY;

	GLint texSize = width * height * depth;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected value in this case is 0 because atomic operations result on uncommitted regions are zeros
	deMemset(exp_data, 0, texSize);

	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	for (GLint sample = 0; sample < mState.samples; ++sample)
	{
		deMemset(out_data, 255, texSize);

		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
						  (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

		std::string shader = st2_compute_atomicVerify;

		// Adjust shader source to texture format
		TokenStrings s		  = createShaderTokens(target, format, sample);
		std::string  dataType = (s.returnType == "ivec4" ? "int" : "uint");

		replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
		replaceToken("<FORMAT>", s.format.c_str(), shader);
		replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
		replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
		replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
		replaceToken("<DATA_TYPE>", dataType.c_str(), shader);
		replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
		replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);

		ProgramSources sources;
		sources << ComputeSource(shader);

		// Build and run shader
		ShaderProgram program(m_context.getRenderContext(), sources);
		if (program.isOk())
		{
			gl.useProgram(program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
			gl.bindImageTexture(0, //unit
								verifyTexture,
								0,		  //level
								GL_FALSE, //layered
								0,		  //layer
								GL_WRITE_ONLY, GL_R8UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.bindImageTexture(1, //unit
								texture,
								level,	//level
								GL_FALSE, //layered
								0,		  //layer
								GL_READ_ONLY, format);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.uniform1i(1, 0 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.uniform1i(2, 1 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.uniform1i(3, widthCommitted /* committed width */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.dispatchCompute(width, height, depth);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
			gl.memoryBarrier(GL_ALL_BARRIER_BITS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

			Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = 0; x < width; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						GLubyte* dataRegion	= exp_data + ((x + y * width) + z * width * height);
						GLubyte* outDataRegion = out_data + ((x + y * width) + z * width * height);
						if (dataRegion[0] != outDataRegion[0])
						{
							printf("%d:%d ", dataRegion[0], outDataRegion[0]);
							result = false;
						}
					}
		}
		else
		{
			mLog << "Compute shader compilation failed (atomic) for target: " << target << ", format: " << format
				 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
				 << ", shaderSource: " << shader.c_str() << " - ";

			result = false;
		}
	}

	Texture::Delete(gl, verifyTexture);

	return result;
}